

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int save_client_hello(ptls_on_client_hello_t *self,ptls_t *tls,
                     ptls_on_client_hello_parameters_t *params)

{
  ptls_iovec_t *ppVar1;
  
  ptls_set_server_name(tls,(char *)(params->server_name).base,(params->server_name).len);
  if ((params->negotiated_protocols).count != 0) {
    ppVar1 = (params->negotiated_protocols).list;
    ptls_set_negotiated_protocol(tls,(char *)ppVar1->base,ppVar1->len);
  }
  if ((params->field_0x50 & 1) != 0) {
    was_esni = was_esni + 1;
  }
  return 0;
}

Assistant:

static int save_client_hello(ptls_on_client_hello_t *self, ptls_t *tls, ptls_on_client_hello_parameters_t *params)
{
    ptls_set_server_name(tls, (const char *)params->server_name.base, params->server_name.len);
    if (params->negotiated_protocols.count != 0)
        ptls_set_negotiated_protocol(tls, (const char *)params->negotiated_protocols.list[0].base,
                                     params->negotiated_protocols.list[0].len);
    if (params->esni)
        ++was_esni;
    return 0;
}